

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O1

void __thiscall CMU462::Matrix3x3::operator+=(Matrix3x3 *this,Matrix3x3 *B)

{
  double *Aij;
  
  this->entries[0].x = B->entries[0].x + this->entries[0].x;
  this->entries[0].y = B->entries[0].y + this->entries[0].y;
  this->entries[0].z = B->entries[0].z + this->entries[0].z;
  this->entries[1].x = B->entries[1].x + this->entries[1].x;
  this->entries[1].y = B->entries[1].y + this->entries[1].y;
  this->entries[1].z = B->entries[1].z + this->entries[1].z;
  this->entries[2].x = B->entries[2].x + this->entries[2].x;
  this->entries[2].y = B->entries[2].y + this->entries[2].y;
  this->entries[2].z = B->entries[2].z + this->entries[2].z;
  return;
}

Assistant:

void Matrix3x3::operator+=( const Matrix3x3& B ) {

    Matrix3x3& A( *this );
    double* Aij = (double*) &A;
    const double* Bij = (const double*) &B;

    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
  }